

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O0

int ps_add_jsgf_string(ps_decoder_t *ps,char *name,char *jsgf_string)

{
  jsgf_t *grammar;
  char *name_00;
  fsg_model_t *fsg_00;
  double dVar1;
  int result;
  float lw;
  jsgf_t *jsgf;
  char *toprule;
  jsgf_rule_t *rule;
  fsg_model_t *fsg;
  char *jsgf_string_local;
  char *name_local;
  ps_decoder_t *ps_local;
  
  grammar = jsgf_parse_string(jsgf_string,(jsgf_t *)0x0);
  if (grammar == (jsgf_t *)0x0) {
    ps_local._4_4_ = -1;
  }
  else {
    name_00 = ps_config_str(ps->config,"toprule");
    if (name_00 == (char *)0x0) {
      toprule = (char *)jsgf_get_public_rule(grammar);
      if ((jsgf_rule_t *)toprule == (jsgf_rule_t *)0x0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
                ,0x35f,"No public rules found in input string\n");
        jsgf_grammar_free(grammar);
        return -1;
      }
    }
    else {
      toprule = (char *)jsgf_get_rule(grammar,name_00);
      if ((jsgf_rule_t *)toprule == (jsgf_rule_t *)0x0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
                ,0x358,"Start rule %s not found\n",name_00);
        jsgf_grammar_free(grammar);
        return -1;
      }
    }
    dVar1 = ps_config_float(ps->config,"lw");
    fsg_00 = jsgf_build_fsg(grammar,(jsgf_rule_t *)toprule,ps->lmath,(float32)(float)dVar1);
    ps_local._4_4_ = ps_add_fsg(ps,name,fsg_00);
    fsg_model_free(fsg_00);
    jsgf_grammar_free(grammar);
  }
  return ps_local._4_4_;
}

Assistant:

int 
ps_add_jsgf_string(ps_decoder_t *ps, const char *name, const char *jsgf_string)
{
  fsg_model_t *fsg;
  jsgf_rule_t *rule;
  char const *toprule;
  jsgf_t *jsgf = jsgf_parse_string(jsgf_string, NULL);
  float lw;
  int result;

  if (!jsgf)
      return -1;

  rule = NULL;
  /* Take the -toprule if specified. */
  if ((toprule = ps_config_str(ps->config, "toprule"))) {
      rule = jsgf_get_rule(jsgf, toprule);
      if (rule == NULL) {
          E_ERROR("Start rule %s not found\n", toprule);
          jsgf_grammar_free(jsgf);
          return -1;
      }
  } else {
      rule = jsgf_get_public_rule(jsgf);
      if (rule == NULL) {
          E_ERROR("No public rules found in input string\n");
          jsgf_grammar_free(jsgf);
          return -1;
      }
  }

  lw = ps_config_float(ps->config, "lw");
  fsg = jsgf_build_fsg(jsgf, rule, ps->lmath, lw);
  result = ps_add_fsg(ps, name, fsg);
  fsg_model_free(fsg);
  jsgf_grammar_free(jsgf);
  return result;
}